

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::String(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  char *pcVar2;
  undefined7 in_register_00000009;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(this->stack_).stackTop_;
  pGVar1 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)(this->stack_).stackEnd_;
  if ((int)CONCAT71(in_register_00000009,copy) == 0) {
    if (pGVar1 <= this_00 + 1) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
      this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)(this->stack_).stackTop_;
    }
    (this->stack_).stackTop_ = (char *)(this_00 + 1);
    (this_00->data_).s.str = (Ch *)0x0;
    pcVar2 = (char *)((long)&this_00->data_ + 8);
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    this_00->flags_ = 0;
    if (str == (Ch *)0x0) {
      __assert_fail("s != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/document.h"
                    ,0x143,
                    "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
                   );
    }
    this_00->flags_ = 0x100005;
    (this_00->data_).s.str = str;
    (this_00->data_).s.length = length;
  }
  else {
    if (pGVar1 <= this_00 + 1) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
      this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)(this->stack_).stackTop_;
    }
    (this->stack_).stackTop_ = (char *)(this_00 + 1);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(this_00,str,length,this->allocator_);
  }
  return true;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy) {
        if (copy)
            new (stack_.template Push<ValueType>()) ValueType(str, length, GetAllocator());
        else
            new (stack_.template Push<ValueType>()) ValueType(str, length);
        return true;
    }